

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  Message *pMVar1;
  uint32_t *puVar2;
  char *pcVar3;
  uint uVar4;
  byte bVar5;
  int in_EDX;
  
  pMVar1 = this->default_instance_;
  puVar2 = this->offsets_;
  pcVar3 = FieldDescriptor::index(field,(char *)field,in_EDX);
  bVar5 = field->type_ - 9;
  uVar4 = 0x7fffffff;
  if (bVar5 < 4) {
    uVar4 = *(uint *)(&DAT_003298e0 + (ulong)bVar5 * 4);
  }
  return (void *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uVar4 & puVar2[(int)pcVar3]));
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8_t*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }